

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  undefined8 uVar1;
  long *plVar2;
  char *pcVar3;
  int iVar4;
  undefined1 auVar5 [12];
  allocator<char> local_1a;
  allocator<char> local_19;
  
  auVar5 = __cxa_rethrow();
  iVar4 = auVar5._8_4_;
  uVar1 = auVar5._0_8_;
  if (iVar4 == 4) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,&local_1a);
  }
  else if (iVar4 == 3) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
  }
  else {
    pcVar3 = (char *)__cxa_begin_catch(uVar1);
    if (iVar4 == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,&local_19);
    }
    else {
      tryTranslators_abi_cxx11_
                (__return_storage_ptr__,this,
                 (const_iterator)
                 (this->m_translators).
                 super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  __cxa_end_catch();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    throw;
                }
                @catch (NSException *exception) {
                    return toString( [exception description] );
                }
#else
                throw;
#endif
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return tryTranslators( m_translators.begin() );
            }
        }